

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall QListWidget::setCurrentRow(QListWidget *this,int row,SelectionFlags command)

{
  QListWidgetPrivate *this_00;
  Data *pDVar1;
  QListModel *pQVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListWidgetPrivate **)
             &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  pDVar1 = (this_00->super_QListViewPrivate).super_QAbstractItemViewPrivate.selectionModel.wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->super_QListViewPrivate).super_QAbstractItemViewPrivate.selectionModel.wp.
             value;
  }
  pQVar2 = QListWidgetPrivate::listModel(this_00);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_40,pQVar2,row,0);
  (**(code **)(*(long *)pQVar3 + 0x60))
            (pQVar3,local_40,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setCurrentRow(int row, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QListWidget);
    d->selectionModel->setCurrentIndex(d->listModel()->index(row), command);
}